

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

char * __thiscall VPLGrammar::Parser::ForStatementNode::GetName(ForStatementNode *this)

{
  ForStatementNode *this_local;
  
  return "ForStatement";
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                int unique_id = scope->GetUnique();
                children_[0]->BuildProgram(scope, out);
                out << "func .L" << unique_id << "_for\n";
                children_[1]->BuildProgram(scope, out);
                out << "    jz .L" << unique_id << "_end_for\n";
                out << "    pop 0\n";
                children_[3]->BuildProgram(scope, out);
                children_[2]->BuildProgram(scope, out);
                out << "    jmp .L" << unique_id << "_for\n";
                out << "func .L" << unique_id << "_end_for\n";
                out << "    pop 0\n";
                out << "func .L" << unique_id << "_end\n";
            }